

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,ft::allocator<int>>::merge<ft::less<int>>
          (list<int,ft::allocator<int>> *this,list<int,ft::allocator<int>> *x,undefined8 param_3,
          undefined8 param_4,__off64_t *param_5,size_t param_6)

{
  int *piVar1;
  uint in_stack_ffffffffffffffa8;
  undefined **local_50;
  int *local_48;
  undefined **local_40;
  int *local_38;
  
  if (this == x) {
    return;
  }
  piVar1 = *(int **)this;
  do {
    piVar1 = *(int **)(piVar1 + 4);
    while( true ) {
      if (*(long *)(x + 0x10) == 0) {
        return;
      }
      local_38 = *(int **)(*(long *)x + 0x10);
      if ((piVar1 != *(int **)(this + 8)) && (*piVar1 <= *local_38)) break;
      local_50 = &PTR__listIterator_0010dd60;
      local_40 = &PTR__listIterator_0010dd60;
      local_48 = piVar1;
      list<int,_ft::allocator<int>_>::splice
                ((list<int,_ft::allocator<int>_> *)this,(int)&local_50,(__off64_t *)x,(int)&local_40
                 ,param_5,param_6,in_stack_ffffffffffffffa8);
    }
  } while( true );
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}